

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qxdgnotificationproxy_p.cpp
# Opt level: O0

void QXdgNotificationInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QString *specVersion;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QXdgNotificationInterface *in_RDI;
  long in_FS_OFFSET;
  uint in_stack_00000014;
  QString *in_stack_00000040;
  QStringList *in_stack_00000048;
  QXdgNotificationInterface *_t;
  QDBusPendingReply<unsigned_int> _r_4;
  QDBusReply<QString> _r_3;
  QDBusPendingReply<QString,_QString,_QString,_QString> _r_2;
  QDBusPendingReply<QList<QString>_> _r_1;
  QDBusPendingReply<> _r;
  QDBusReply<QString> *in_stack_ffffffffffffff08;
  QDBusPendingReply<unsigned_int> *other;
  QDBusReply<QString> *in_stack_ffffffffffffff10;
  QDBusPendingReply<unsigned_int> *this;
  undefined8 in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff38;
  QString *in_stack_ffffffffffffff40;
  QXdgNotificationInterface *in_stack_ffffffffffffff48;
  undefined1 local_80 [28];
  uint in_stack_ffffffffffffff9c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    specVersion = (QString *)(ulong)in_EDX;
    switch(specVersion) {
    case (QString *)0x0:
      ActionInvoked((QXdgNotificationInterface *)in_stack_ffffffffffffff10,
                    (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                    (QString *)in_stack_ffffffffffffff08);
      break;
    case (QString *)0x1:
      NotificationClosed((QXdgNotificationInterface *)0xb3bf60,
                         (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (uint)in_stack_ffffffffffffff08);
      break;
    case (QString *)0x2:
      closeNotification((QXdgNotificationInterface *)in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff9c);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<>::operator=
                  ((QDBusPendingReply<> *)in_stack_ffffffffffffff10,
                   (QDBusPendingReply<> *)in_stack_ffffffffffffff08);
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0xb3bfbe);
      break;
    case (QString *)0x3:
      getCapabilities((QXdgNotificationInterface *)specVersion);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<QList<QString>_>::operator=
                  ((QDBusPendingReply<QList<QString>_> *)in_stack_ffffffffffffff10,
                   (QDBusPendingReply<QList<QString>_> *)in_stack_ffffffffffffff08);
      }
      QDBusPendingReply<QList<QString>_>::~QDBusPendingReply
                ((QDBusPendingReply<QList<QString>_> *)0xb3c011);
      break;
    case (QString *)0x4:
      getServerInformation((QXdgNotificationInterface *)specVersion);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<QString,_QString,_QString,_QString>::operator=
                  ((QDBusPendingReply<QString,_QString,_QString,_QString> *)
                   in_stack_ffffffffffffff10,
                   (QDBusPendingReply<QString,_QString,_QString,_QString> *)
                   in_stack_ffffffffffffff08);
      }
      QDBusPendingReply<QString,_QString,_QString,_QString>::~QDBusPendingReply
                ((QDBusPendingReply<QString,_QString,_QString,_QString> *)0xb3c064);
      break;
    case (QString *)0x5:
      memset(local_80,0xaa,0x58);
      getServerInformation
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 specVersion);
      if (*(long *)in_RCX != 0) {
        QDBusReply<QString>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      QDBusReply<QString>::~QDBusReply(in_stack_ffffffffffffff10);
      break;
    case (QString *)0x6:
      other = *(QDBusPendingReply<unsigned_int> **)(in_RCX + 0x28);
      this = *(QDBusPendingReply<unsigned_int> **)(in_RCX + 0x30);
      notify(in_RDI,(QString *)(ulong)in_EDX,in_stack_00000014,(QString *)in_RCX,(QString *)in_RDI,
             in_stack_00000040,in_stack_00000048,(QVariantMap *)_t,(int)_a);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<unsigned_int>::operator=(this,other);
      }
      QDBusPendingReply<unsigned_int>::~QDBusPendingReply
                ((QDBusPendingReply<unsigned_int> *)0xb3c173);
    }
  }
  if ((in_ESI == 5) &&
     (bVar2 = QtMocHelpers::
              indexOfMethod<void(QXdgNotificationInterface::*)(unsigned_int,QString_const&)>
                        (in_RCX,(void **)ActionInvoked,0,0), !bVar2)) {
    QtMocHelpers::indexOfMethod<void(QXdgNotificationInterface::*)(unsigned_int,unsigned_int)>
              (in_RCX,(void **)NotificationClosed,0,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXdgNotificationInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QXdgNotificationInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ActionInvoked((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->NotificationClosed((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 2: { QDBusPendingReply<> _r = _t->closeNotification((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QStringList> _r = _t->getCapabilities();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QStringList>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<QString,QString,QString,QString> _r = _t->getServerInformation();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QString,QString,QString>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusReply<QString> _r = _t->getServerInformation((*reinterpret_cast< std::add_pointer_t<QString&>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingReply<uint> _r = _t->notify((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<QVariantMap>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[8])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<uint>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , const QString & )>(_a, &QXdgNotificationInterface::ActionInvoked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , uint )>(_a, &QXdgNotificationInterface::NotificationClosed, 1))
            return;
    }
}